

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter<spdlog::details::null_scoped_padder>::format
          (z_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  memory_buf_t *in_RCX;
  buffer<char> *in_RDI;
  undefined1 uVar2;
  bool is_negative;
  int total_minutes;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  log_msg *msg_00;
  
  msg_00 = (log_msg *)0x6;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,6,(padding_info *)&in_RDI->ptr_,in_RCX);
  iVar1 = get_cached_offset((z_formatter<spdlog::details::null_scoped_padder> *)in_RCX,msg_00,
                            (tm *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar2 = iVar1 < 0;
  if ((bool)uVar2) {
    in_stack_ffffffffffffffce = 0x2d;
    fmt::v6::internal::buffer<char>::push_back(in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    in_stack_ffffffffffffffcd = 0x2b;
    fmt::v6::internal::buffer<char>::push_back(in_RDI,in_stack_ffffffffffffffb8);
  }
  fmt_helper::pad2(in_stack_ffffffffffffffd4,
                   (memory_buf_t *)
                   CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffce,
                                           CONCAT15(in_stack_ffffffffffffffcd,
                                                    CONCAT14(in_stack_ffffffffffffffcc,
                                                             in_stack_ffffffffffffffc8)))));
  uVar3 = 0x3a;
  fmt::v6::internal::buffer<char>::push_back(in_RDI,in_stack_ffffffffffffffb8);
  fmt_helper::pad2(in_stack_ffffffffffffffd4,
                   (memory_buf_t *)
                   CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffce,
                                           CONCAT15(in_stack_ffffffffffffffcd,
                                                    CONCAT14(uVar3,in_stack_ffffffffffffffc8)))));
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }